

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigTests.cpp
# Opt level: O1

vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> * __thiscall
deqp::egl::ChooseConfigRandomCase::genRandomAttributes
          (vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
           *__return_storage_ptr__,ChooseConfigRandomCase *this,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *attribSet,
          int numAttribs,Random *rnd)

{
  _Rb_tree_header *p_Var1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  AttribSpec *__args;
  ulong uVar9;
  int ndx;
  long lVar10;
  bool bVar11;
  vector<deqp::egl::ChooseConfigRandomCase::AttribSpec,_std::allocator<deqp::egl::ChooseConfigRandomCase::AttribSpec>_>
  candidates;
  __normal_iterator<deqp::egl::ChooseConfigRandomCase::AttribSpec_*,_std::vector<deqp::egl::ChooseConfigRandomCase::AttribSpec,_std::allocator<deqp::egl::ChooseConfigRandomCase::AttribSpec>_>_>
  local_68;
  iterator iStack_60;
  AttribSpec *local_58;
  AttribSpec local_48;
  
  lVar10 = 0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58 = (AttribSpec *)0x0;
  local_68._M_current = (AttribSpec *)0x0;
  iStack_60._M_current = (AttribSpec *)0x0;
  p_Var1 = &(attribSet->_M_t)._M_impl.super__Rb_tree_header;
  do {
    __args = genRandomAttributes::attributes + lVar10;
    p_Var7 = (attribSet->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var6 = &p_Var1->_M_header;
    if (p_Var7 != (_Base_ptr)0x0) {
      do {
        bVar11 = (uint)*(size_t *)(p_Var7 + 1) < __args->attribute;
        if (!bVar11) {
          p_Var6 = p_Var7;
        }
        p_Var7 = (&p_Var7->_M_left)[bVar11];
      } while (p_Var7 != (_Base_ptr)0x0);
    }
    p_Var8 = p_Var1;
    if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
       (p_Var8 = (_Rb_tree_header *)p_Var6,
       __args->attribute < (uint)((_Rb_tree_header *)p_Var6)->_M_node_count)) {
      p_Var8 = p_Var1;
    }
    if (p_Var8 != p_Var1) {
      if (iStack_60._M_current == local_58) {
        std::
        vector<deqp::egl::ChooseConfigRandomCase::AttribSpec,std::allocator<deqp::egl::ChooseConfigRandomCase::AttribSpec>>
        ::_M_realloc_insert<deqp::egl::ChooseConfigRandomCase::AttribSpec_const&>
                  ((vector<deqp::egl::ChooseConfigRandomCase::AttribSpec,std::allocator<deqp::egl::ChooseConfigRandomCase::AttribSpec>>
                    *)&local_68,iStack_60,__args);
      }
      else {
        uVar2 = *(undefined4 *)&genRandomAttributes::attributes[lVar10].field_0x4;
        uVar3 = *(undefined4 *)&genRandomAttributes::attributes[lVar10].getValue;
        uVar4 = *(undefined4 *)((long)&genRandomAttributes::attributes[lVar10].getValue + 4);
        (iStack_60._M_current)->attribute = __args->attribute;
        *(undefined4 *)&(iStack_60._M_current)->field_0x4 = uVar2;
        *(undefined4 *)&(iStack_60._M_current)->getValue = uVar3;
        *(undefined4 *)((long)&(iStack_60._M_current)->getValue + 4) = uVar4;
        iStack_60._M_current = iStack_60._M_current + 1;
      }
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x16);
  if (0 < numAttribs) {
    do {
      local_48._0_8_ = 0;
      local_48.getValue = (_func_EGLint_Random_ptr *)0x0;
      de::Random::
      choose<__gnu_cxx::__normal_iterator<deqp::egl::ChooseConfigRandomCase::AttribSpec*,std::vector<deqp::egl::ChooseConfigRandomCase::AttribSpec,std::allocator<deqp::egl::ChooseConfigRandomCase::AttribSpec>>>,deqp::egl::ChooseConfigRandomCase::AttribSpec*>
                (rnd,local_68,
                 (__normal_iterator<deqp::egl::ChooseConfigRandomCase::AttribSpec_*,_std::vector<deqp::egl::ChooseConfigRandomCase::AttribSpec,_std::allocator<deqp::egl::ChooseConfigRandomCase::AttribSpec>_>_>
                  )iStack_60._M_current,&local_48,1);
      uVar9 = local_48._0_8_ & 0xffffffff;
      uVar5 = (*local_48.getValue)(rnd);
      local_48._0_8_ = (ulong)uVar5 << 0x20 | uVar9;
      std::vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>>::
      emplace_back<std::pair<unsigned_int,int>>
                ((vector<std::pair<unsigned_int,int>,std::allocator<std::pair<unsigned_int,int>>> *)
                 __return_storage_ptr__,(pair<unsigned_int,_int> *)&local_48);
      numAttribs = numAttribs + -1;
    } while (numAttribs != 0);
  }
  if (local_68._M_current != (AttribSpec *)0x0) {
    operator_delete(local_68._M_current,(long)local_58 - (long)local_68._M_current);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<EGLenum, EGLint> > genRandomAttributes (const std::set<EGLenum>& attribSet, int numAttribs, de::Random& rnd)
	{
		static const struct AttribSpec attributes[] =
		{
			{ EGL_BUFFER_SIZE,				ChooseConfigRandomCase::getInt<0, 32>,		},
			{ EGL_RED_SIZE,					ChooseConfigRandomCase::getInt<0, 8>,		},
			{ EGL_GREEN_SIZE,				ChooseConfigRandomCase::getInt<0, 8>,		},
			{ EGL_BLUE_SIZE,				ChooseConfigRandomCase::getInt<0, 8>,		},
			{ EGL_LUMINANCE_SIZE,			ChooseConfigRandomCase::getInt<0, 1>,		},
			{ EGL_ALPHA_SIZE,				ChooseConfigRandomCase::getInt<0, 8>,		},
			{ EGL_ALPHA_MASK_SIZE,			ChooseConfigRandomCase::getInt<0, 1>,		},
			{ EGL_BIND_TO_TEXTURE_RGB,		ChooseConfigRandomCase::getBool,			},
			{ EGL_BIND_TO_TEXTURE_RGBA,		ChooseConfigRandomCase::getBool,			},
			{ EGL_COLOR_BUFFER_TYPE,		ChooseConfigRandomCase::getBufferType,		},
			{ EGL_CONFIG_CAVEAT,			ChooseConfigRandomCase::getConfigCaveat,	},
//			{ EGL_CONFIG_ID,				0/*special*/,		},
			{ EGL_CONFORMANT,				ChooseConfigRandomCase::getApiBits,			},
			{ EGL_DEPTH_SIZE,				ChooseConfigRandomCase::getInt<0, 32>,		},
			{ EGL_LEVEL,					ChooseConfigRandomCase::getInt<0, 1>,		},
//			{ EGL_MATCH_NATIVE_PIXMAP,		EGL_NONE,			},
			{ EGL_MAX_SWAP_INTERVAL,		ChooseConfigRandomCase::getInt<0, 2>,		},
			{ EGL_MIN_SWAP_INTERVAL,		ChooseConfigRandomCase::getInt<0, 1>,		},
			{ EGL_NATIVE_RENDERABLE,		ChooseConfigRandomCase::getBool,			},
//			{ EGL_NATIVE_VISUAL_TYPE,		EGL_DONT_CARE,		},
			{ EGL_RENDERABLE_TYPE,			ChooseConfigRandomCase::getApiBits,			},
			{ EGL_SAMPLE_BUFFERS,			ChooseConfigRandomCase::getInt<0, 1>,		},
			{ EGL_SAMPLES,					ChooseConfigRandomCase::getInt<0, 1>,		},
			{ EGL_STENCIL_SIZE,				ChooseConfigRandomCase::getInt<0, 1>,		},
			{ EGL_SURFACE_TYPE,				ChooseConfigRandomCase::getSurfaceType,		},
//			{ EGL_TRANSPARENT_TYPE,			EGL_TRANSPARENT_RGB,},
//			{ EGL_TRANSPARENT_RED_VALUE,	ChooseConfigRandomCase::getInt<0, 255>,		},
//			{ EGL_TRANSPARENT_GREEN_VALUE,	ChooseConfigRandomCase::getInt<0, 255>,		},
//			{ EGL_TRANSPARENT_BLUE_VALUE,	ChooseConfigRandomCase::getInt<0, 255>,		}
		};

		std::vector<std::pair<EGLenum, EGLint> > out;

		// Build list to select from
		std::vector<AttribSpec> candidates;
		for (int ndx = 0; ndx < (int)DE_LENGTH_OF_ARRAY(attributes); ndx++)
		{
			if (attribSet.find(attributes[ndx].attribute) != attribSet.end())
				candidates.push_back(attributes[ndx]);
		}

		for (int attribNdx = 0; attribNdx < numAttribs; attribNdx++)
		{
			AttribSpec spec = rnd.choose<AttribSpec>(candidates.begin(), candidates.end());
			out.push_back(std::make_pair(spec.attribute, spec.getValue(rnd)));
		}

		return out;
	}